

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gamefield.c
# Opt level: O0

void OnUpdateGamefield(Gamefield *gamefield)

{
  IntVec2 coords_00;
  IntVec2 coords_01;
  IntVec2 coords_02;
  IntVec2 coords_03;
  uint8_t *__ptr;
  long in_RDI;
  uint8_t *rawPixelArray;
  IntVec2 coords;
  size_t x;
  size_t y;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  Gamefield *in_stack_ffffffffffffffd0;
  Gamefield *in_stack_ffffffffffffffd8;
  ulong local_18;
  ulong local_10;
  
  *(char *)(in_RDI + 0x18) = *(char *)(in_RDI + 0x18) + '\x01';
  for (local_10 = 0; local_10 < *(uint *)(in_RDI + 8); local_10 = local_10 + 1) {
    for (local_18 = 0; local_18 < *(uint *)(in_RDI + 4); local_18 = local_18 + 1) {
      if (*(char *)(*(long *)(in_RDI + 0x10) + (local_10 * *(uint *)(in_RDI + 4) + local_18) * 0x14
                   + 8) != *(char *)(in_RDI + 0x18)) {
        if (*(int *)(*(long *)(in_RDI + 0x10) + (local_10 * *(uint *)(in_RDI + 4) + local_18) * 0x14
                    + 4) == 0) {
          coords_00.y = in_stack_ffffffffffffffc4;
          coords_00.x = in_stack_ffffffffffffffc0;
          SandStep((Gamefield *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                   coords_00);
        }
        else if (*(int *)(*(long *)(in_RDI + 0x10) +
                          (local_10 * *(uint *)(in_RDI + 4) + local_18) * 0x14 + 4) == 1) {
          coords_01.y = in_stack_ffffffffffffffc4;
          coords_01.x = in_stack_ffffffffffffffc0;
          WaterStep((Gamefield *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    coords_01);
        }
        else if (*(int *)(*(long *)(in_RDI + 0x10) +
                          (local_10 * *(uint *)(in_RDI + 4) + local_18) * 0x14 + 4) == 5) {
          coords_02.y = in_stack_ffffffffffffffc4;
          coords_02.x = in_stack_ffffffffffffffc0;
          SmokeStep((Gamefield *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    coords_02);
        }
        else if (*(int *)(*(long *)(in_RDI + 0x10) +
                          (local_10 * *(uint *)(in_RDI + 4) + local_18) * 0x14 + 4) == 6) {
          coords_03.y = (int)local_10;
          coords_03.x = (int)local_18;
          FireStep(in_stack_ffffffffffffffd8,coords_03);
        }
      }
    }
  }
  __ptr = GetRawColor32Array(in_stack_ffffffffffffffd0);
  (*glad_glTexImage2D)
            (0xde1,0,0x1908,*(GLsizei *)(in_RDI + 4),*(GLsizei *)(in_RDI + 8),0,0x1908,0x1401,__ptr)
  ;
  free(__ptr);
  return;
}

Assistant:

void OnUpdateGamefield(Gamefield* gamefield) {
    gamefield->simulationStep += 1;
    for (size_t y = 0; y < gamefield->height; y++) {
        for (size_t x = 0; x < gamefield->width; x++) {
            if (gamefield->pixels[y * gamefield->width + x].lastUpdatedFrameNumber == gamefield->simulationStep) continue;
            IntVec2 coords;
            coords.x = x;
            coords.y = y;
            if (gamefield->pixels[y * gamefield->width + x].pixelType == Sand) {
                SandStep(gamefield, coords);
            }
            else if (gamefield->pixels[y * gamefield->width + x].pixelType == Water) {
                WaterStep(gamefield, coords);
            }
            else if (gamefield->pixels[y * gamefield->width + x].pixelType == Smoke) {
                SmokeStep(gamefield, coords);
            }
            else if (gamefield->pixels[y * gamefield->width + x].pixelType == Fire) {
                FireStep(gamefield, coords);
            }
        }
    }

    uint8_t* rawPixelArray = NULL;
    if (rawPixelArray == NULL) {
        rawPixelArray = GetRawColor32Array(gamefield);
    }
    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, gamefield->width, gamefield->height, 0, GL_RGBA, GL_UNSIGNED_BYTE, rawPixelArray);
    free(rawPixelArray);
}